

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# address.c
# Opt level: O0

ubyte getbyte(uint address)

{
  uchar local_9;
  uint address_local;
  
  if (address < 0x8000) {
    local_9 = RAM[address];
  }
  else if (address < 0xc000) {
    if (romsel == '\f') {
      local_9 = lang_ROM[(int)(address - 0x8000)];
    }
    else {
      local_9 = 0xff;
    }
  }
  else if ((address < 0xff00) && (0xfbff < address)) {
    if ((address & 0xff00) == 0xfe00) {
      local_9 = (*rsheila[(char)address])();
    }
    else {
      local_9 = 0xff;
    }
  }
  else {
    local_9 = OS_ROM[(int)(address - 0xc000)];
  }
  return local_9;
}

Assistant:

ubyte getbyte(uint address) {

    if (address < 0x8000) return RAM[address];
    // If address is below the 32K mark access the RAM


    if (address < 0xC000) return (romsel == 0xC ? lang_ROM[address - 0x8000] : (ubyte) 0xFF);
    // If address is below the 48K mark access the language ROM
    if ((address > 0xFEFF) || (address < 0xFC00)) return OS_ROM[address - 0xC000];
    // If address is outside the 3 pages of memmapped io,
    // access the OS_ROM
    return ((address & 0xFF00) == 0xFE00) ? rsheila[(char) (address)]() : (ubyte) 0xff;

}